

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
array<CInput::CJoystick,_allocator_default<CInput::CJoystick>_>::clear
          (array<CInput::CJoystick,_allocator_default<CInput::CJoystick>_> *this)

{
  CJoystick *pCVar1;
  
  allocator_default<CInput::CJoystick>::free_array(this->list);
  this->list_size = 1;
  pCVar1 = allocator_default<CInput::CJoystick>::alloc_array(1);
  this->list = pCVar1;
  this->num_elements = 0;
  return;
}

Assistant:

void clear()
	{
		ALLOCATOR::free_array(list);
		list_size = 1;
		list = ALLOCATOR::alloc_array(list_size);
		num_elements = 0;
	}